

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O2

void __thiscall
QAnimationGroup::removeAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  qsizetype qVar1;
  char *msg;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  QAbstractAnimation *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = animation;
  if (animation == (QAbstractAnimation *)0x0) {
    msg = "QAnimationGroup::remove: cannot remove null animation";
  }
  else {
    qVar1 = QtPrivate::indexOf<QAbstractAnimation*,QAbstractAnimation*>
                      ((QList<QAbstractAnimation_*> *)(*(long *)(this + 8) + 0xa0),&local_18,0);
    if (qVar1 != -1) {
      takeAnimation(this,(int)qVar1);
      goto LAB_00365bbb;
    }
    msg = "QAnimationGroup::remove: animation is not part of this group";
  }
  local_38.context.category = "default";
  local_38.context.function._4_4_ = 0;
  local_38.context._12_8_ = 0;
  local_38.context._4_8_ = 0;
  local_38.context.version = 2;
  QMessageLogger::warning(&local_38,msg);
LAB_00365bbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationGroup::removeAnimation(QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (!animation) {
        qWarning("QAnimationGroup::remove: cannot remove null animation");
        return;
    }
    qsizetype index = d->animations.indexOf(animation);
    if (index == -1) {
        qWarning("QAnimationGroup::remove: animation is not part of this group");
        return;
    }

    takeAnimation(index);
}